

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenUnary(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef value)

{
  Unary *this;
  
  this = (Unary *)MixedArena::allocSpace(&module->allocator,0x20,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (this->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  this->op = op;
  this->value = value;
  wasm::Unary::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenUnary(BinaryenModuleRef module,
                                    BinaryenOp op,
                                    BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeUnary(UnaryOp(op), (Expression*)value));
}